

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int http_parse(HTTP_INFO *hi)

{
  char *pcVar1;
  BOOL BVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  short *psVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  long *plVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char local_238 [256];
  char t1 [256];
  
  if (hi->r_len < 1) {
    return -1;
  }
  pcVar1 = hi->r_buf;
  pcVar13 = (hi->response).location;
  pcVar11 = pcVar1;
LAB_0011118a:
  do {
    while (hi->header_end != '\0') {
      BVar2 = (hi->response).chunked;
      sVar8 = hi->length;
      if (BVar2 == '\x01') {
        if (sVar8 == 0xffffffffffffffff) {
          pcVar12 = pcVar1 + (hi->r_len - (long)pcVar11);
          if ((long)pcVar12 < 1) goto LAB_0011164a;
          psVar6 = (short *)strstr(pcVar11,"\r\n");
          if (psVar6 == (short *)0x0) goto LAB_0011166c;
          *(undefined1 *)psVar6 = 0;
          lVar9 = strtol(pcVar11,(char **)0x0,0x10);
          hi->length = lVar9;
          if (lVar9 == 0) {
            (hi->response).chunked = '\0';
          }
          else {
            plVar10 = &(hi->response).content_length;
            *plVar10 = *plVar10 + lVar9;
          }
          goto LAB_00111588;
        }
        if (0 < (long)sVar8) goto LAB_0011131f;
      }
      else {
        if (0 < (long)sVar8) {
LAB_0011131f:
          pcVar12 = pcVar1 + (hi->r_len - (long)pcVar11);
          lVar9 = hi->body_size;
          uVar3 = hi->body_len;
          if ((long)pcVar12 <= (long)sVar8) {
            if ((long)uVar3 < lVar9 + -1) {
              pcVar1 = pcVar12 + uVar3;
              pcVar13 = (char *)(~uVar3 + lVar9);
              if ((long)pcVar1 < lVar9) {
                pcVar13 = pcVar12;
              }
              pcVar7 = (char *)0xffffffffffffffff;
              if ((long)pcVar1 < lVar9) {
                pcVar7 = pcVar12;
              }
              strncpy(hi->body + uVar3,pcVar11,(size_t)pcVar13);
              lVar9 = (&hi->body_size)[(long)pcVar1 < lVar9];
              hi->body_len = (long)(pcVar7 + lVar9);
              hi->body[(long)(pcVar7 + lVar9)] = '\0';
            }
            lVar9 = hi->length - (long)pcVar12;
            hi->length = lVar9;
            hi->r_len = 0;
            if ((hi->response).chunked != '\0') {
              return 0;
            }
            if (0 < lVar9) {
              return 0;
            }
            return 1;
          }
          if ((long)uVar3 < lVar9 + -1) {
            if ((long)(uVar3 + sVar8) < lVar9) {
              strncpy(hi->body + uVar3,pcVar11,sVar8);
              lVar9 = hi->length;
              plVar10 = &hi->body_len;
            }
            else {
              strncpy(hi->body + uVar3,pcVar11,lVar9 + ~uVar3);
              lVar9 = -1;
              plVar10 = &hi->body_size;
            }
            lVar4 = *plVar10;
            hi->body_len = lVar9 + lVar4;
            hi->body[lVar9 + lVar4] = '\0';
          }
          if (((hi->response).chunked != '\x01') || ((long)pcVar12 - hi->length < 2)) {
            return -1;
          }
          pcVar11 = pcVar11 + hi->length + 2;
          hi->length = -1;
          goto LAB_0011118a;
        }
        if (BVar2 == '\0') {
          return 1;
        }
      }
      if ((2 < hi->r_len) && (*(short *)pcVar11 == 0xa0d)) {
        pcVar11 = pcVar11 + 2;
        hi->length = -1;
        goto LAB_0011118a;
      }
      hi->length = -1;
      hi->r_len = 0;
    }
    psVar6 = (short *)strstr(pcVar11,"\r\n");
    if (psVar6 == (short *)0x0) {
      pcVar13 = pcVar1 + (hi->r_len - (long)pcVar11);
      if ((long)pcVar13 < 1) {
LAB_0011164a:
        hi->r_len = 0;
      }
      else {
        strncpy(pcVar1,pcVar11,(size_t)pcVar13);
        pcVar13[(long)hi->r_buf] = '\0';
        hi->r_len = (long)pcVar13;
      }
      return 0;
    }
    *(undefined1 *)psVar6 = 0;
    if (psVar6 == (short *)pcVar11 || (long)psVar6 - (long)pcVar11 < 0) {
      hi->header_end = '\x01';
      pcVar11 = (char *)(psVar6 + 1);
      if ((hi->response).chunked != '\x01') {
        hi->length = (hi->response).content_length;
        goto LAB_0011118a;
      }
      pcVar12 = pcVar1 + (hi->r_len - (long)pcVar11);
      if ((long)pcVar12 < 1) {
        hi->r_len = 0;
      }
      else {
        pcVar7 = strstr(pcVar11,"\r\n");
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
          lVar9 = strtol(pcVar11,(char **)0x0,0x10);
          hi->length = lVar9;
          if (lVar9 == 0) {
            (hi->response).chunked = '\0';
          }
          else {
            plVar10 = &(hi->response).content_length;
            *plVar10 = *plVar10 + lVar9;
          }
          pcVar11 = pcVar7 + 2;
          goto LAB_0011118a;
        }
LAB_0011166c:
        strncpy(pcVar1,pcVar11,(size_t)pcVar12);
        hi->r_buf[(long)pcVar12] = '\0';
        hi->r_len = (long)pcVar12;
      }
      hi->length = -1;
      return 0;
    }
    pcVar11 = strtoken(pcVar11,t1,0x100);
    if ((pcVar11 != (char *)0x0) &&
       (pcVar11 = strtoken(pcVar11,local_238,0x100), pcVar11 != (char *)0x0)) {
      iVar5 = strncasecmp(t1,"HTTP",4);
      if (iVar5 == 0) {
        iVar5 = atoi(local_238);
        (hi->response).status = iVar5;
      }
      else {
        iVar5 = strncasecmp(t1,"set-cookie:",0xb);
        if (iVar5 == 0) {
          snprintf((hi->response).cookie,0x200,"%s",local_238);
        }
        else {
          iVar5 = strncasecmp(t1,"location:",9);
          if (iVar5 == 0) {
            sVar8 = strlen(local_238);
            strncpy(pcVar13,local_238,(long)(int)sVar8);
            pcVar13[(int)sVar8] = '\0';
          }
          else {
            iVar5 = strncasecmp(t1,"content-length:",0xf);
            if (iVar5 == 0) {
              iVar5 = atoi(local_238);
              (hi->response).content_length = (long)iVar5;
            }
            else {
              iVar5 = strncasecmp(t1,"transfer-encoding:",0x12);
              if (iVar5 == 0) {
                iVar5 = strncasecmp(local_238,"chunked",7);
                if (iVar5 == 0) {
                  (hi->response).chunked = '\x01';
                }
              }
              else {
                iVar5 = strncasecmp(t1,"connection:",0xb);
                if ((iVar5 == 0) && (iVar5 = strncasecmp(local_238,"close",5), iVar5 == 0)) {
                  (hi->response).close = '\x01';
                }
              }
            }
          }
        }
      }
    }
LAB_00111588:
    pcVar11 = (char *)(psVar6 + 1);
  } while( true );
}

Assistant:

static int http_parse(HTTP_INFO *hi)
{
    char    *p1, *p2;
    long    len;


    if(hi->r_len <= 0) return -1;

    p1 = hi->r_buf;

    while(1)
    {
        if(hi->header_end == FALSE)     // header parser
        {
            if((p2 = strstr(p1, "\r\n")) != NULL)
            {
                len = (long)(p2 - p1);
                *p2 = 0;

                if(len > 0)
                {
                    // printf("header: %s(%ld)\n", p1, len);

                    http_header(hi, p1);
                    p1 = p2 + 2;    // skip CR+LF
                }
                else
                {
                    hi->header_end = TRUE; // reach the header-end.

                    // printf("header_end .... \n");

                    p1 = p2 + 2;    // skip CR+LF

                    if(hi->response.chunked == TRUE)
                    {
                        len = hi->r_len - (p1 - hi->r_buf);
                        if(len > 0)
                        {
                            if((p2 = strstr(p1, "\r\n")) != NULL)
                            {
                                *p2 = 0;

                                if((hi->length = strtol(p1, NULL, 16)) == 0)
                                {
                                    hi->response.chunked = FALSE;
                                }
                                else
                                {
                                    hi->response.content_length += hi->length;
                                }
                                p1 = p2 + 2;    // skip CR+LF
                            }
                            else
                            {
                                // copy the data as chunked size ...
                                strncpy(hi->r_buf, p1, len);
                                hi->r_buf[len] = 0;
                                hi->r_len = len;
                                hi->length = -1;

                                break;
                            }
                        }
                        else
                        {
                            hi->r_len = 0;
                            hi->length = -1;

                            break;
                        }
                    }
                    else
                    {
                        hi->length = hi->response.content_length;
                    }
                }

            }
            else
            {
                len = hi->r_len - (p1 - hi->r_buf);
                if(len  > 0)
                {
                    // keep the partial header data ...
                    strncpy(hi->r_buf, p1, len);
                    hi->r_buf[len] = 0;
                    hi->r_len = len;
                }
                else
                {
                    hi->r_len = 0;
                }

                break;
            }
        }
        else    // body parser ...
        {
            if(hi->response.chunked == TRUE && hi->length == -1)
            {
                len = hi->r_len - (p1 - hi->r_buf);
                if(len > 0)
                {
                    if ((p2 = strstr(p1, "\r\n")) != NULL)
                    {
                        *p2 = 0;

                        if((hi->length = strtol(p1, NULL, 16)) == 0)
                        {
                            hi->response.chunked = FALSE;
                        }
                        else
                        {
                            hi->response.content_length += hi->length;
                        }

                        p1 = p2 + 2;    // skip CR+LF
                    }
                    else
                    {
                        // copy the remain data as chunked size ...
                        strncpy(hi->r_buf, p1, len);
                        hi->r_buf[len] = 0;
                        hi->r_len = len;
                        hi->length = -1;

                        break;
                    }
                }
                else
                {
                    hi->r_len = 0;

                    break;
                }
            }
            else
            {
                if(hi->length > 0)
                {
                    len = hi->r_len - (p1 - hi->r_buf);

                    if(len > hi->length)
                    {
                        // copy the data for response ..
                        if(hi->body_len < hi->body_size-1)
                        {
                            if (hi->body_size > (hi->body_len + hi->length))
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->length);
                                hi->body_len += hi->length;
                                hi->body[hi->body_len] = 0;
                            }
                            else
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->body_size - hi->body_len - 1);
                                hi->body_len = hi->body_size - 1;
                                hi->body[hi->body_len] = 0;
                            }
                        }

                        p1 += hi->length;
                        len -= hi->length;

                        if(hi->response.chunked == TRUE && len >= 2)
                        {
                            p1 += 2;    // skip CR+LF
                            hi->length = -1;
                        }
                        else
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        // copy the data for response ..
                        if(hi->body_len < hi->body_size-1)
                        {
                            if (hi->body_size > (hi->body_len + len))
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, len);
                                hi->body_len += len;
                                hi->body[hi->body_len] = 0;
                            }
                            else
                            {
                                strncpy(&(hi->body[hi->body_len]), p1, hi->body_size - hi->body_len - 1);
                                hi->body_len = hi->body_size - 1;
                                hi->body[hi->body_len] = 0;
                            }
                        }

                        hi->length -= len;
                        hi->r_len = 0;

                        if(hi->response.chunked == FALSE && hi->length <= 0) return 1;

                        break;
                    }
                }
                else
                {
                    if(hi->response.chunked == FALSE) return 1;

                    // chunked size check ..
                    if((hi->r_len > 2) && (memcmp(p1, "\r\n", 2) == 0))
                    {
                        p1 += 2;
                        hi->length = -1;
                    }
                    else
                    {
                        hi->length = -1;
                        hi->r_len = 0;
                    }
                }
            }
        }
    }

    return 0;
}